

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall test_solvers_2x3::test_method(test_solvers_2x3 *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  local_60;
  unsigned_long uStack_38;
  size_t expected_assignment [2];
  int costs [6];
  test_solvers_2x3 *this_local;
  
  expected_assignment[1] = 0x200000001;
  uStack_38 = 0;
  expected_assignment[0] = 2;
  make_matrix<int>(&local_60,(int *)(expected_assignment + 1),2,3);
  make_vector<unsigned_long>(&local_78,&uStack_38,2);
  assert_solvers_result<int>(&local_60,1,&local_78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_78);
  boost::numeric::ublas::
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  ::~matrix(&local_60);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_solvers_2x3)
{
  const int costs[] = {1, 2, 0,
                       1, 3, 0};
  const std::size_t expected_assignment[] = {0, 2};
  assert_solvers_result(make_matrix(costs, 2, 3), 1, make_vector(expected_assignment, 2));
}